

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O1

void __thiscall
QPixmapIconEngine::addFile
          (QPixmapIconEngine *this,QString *fileName,QSize *size,Mode mode,State state)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QSize QVar5;
  QSize QVar6;
  pointer pQVar7;
  ssize_t sVar8;
  undefined4 in_register_0000000c;
  QSize *__nbytes;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf_01;
  void *__buf_02;
  long lVar9;
  QImage *i;
  QImage *this_00;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  undefined1 auVar15 [16];
  QArrayDataPointer<QImage> local_118;
  undefined1 local_f8 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_e8;
  QArrayData *local_e0;
  char16_t *local_d8;
  QSize *pQStack_d0;
  QSize local_c8;
  Mode local_c0;
  State local_bc;
  undefined1 local_b8 [16];
  QImageData *local_a8;
  QByteArray local_98;
  QFileInfo local_80 [8];
  QString local_78;
  QString local_60;
  undefined1 local_48 [16];
  long local_38;
  
  __nbytes = (QSize *)CONCAT44(in_register_0000000c,mode);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size != 0) {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    cVar1 = QString::startsWith((QChar)(char16_t)fileName,0x3a);
    if (cVar1 == '\0') {
      QFileInfo::QFileInfo(local_80,fileName);
      QFileInfo::absoluteFilePath();
    }
    else {
      local_78.d.d = (fileName->d).d;
      local_78.d.ptr = (fileName->d).ptr;
      __nbytes = (QSize *)(fileName->d).size;
      local_78.d.size = (qsizetype)__nbytes;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    if (cVar1 == '\0') {
      QFileInfo::~QFileInfo(local_80);
    }
    uVar11 = (size->ht).m_i | (size->wd).m_i;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_cbe27::ImageReader::ImageReader((ImageReader *)local_48,&local_78);
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QImageReader::format(&local_98,(QImageReader *)local_48);
    if ((undefined1 *)local_98.d.size != (undefined1 *)0x0) {
      local_a8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_b8);
      local_f8._0_8_ = "ico";
      bVar2 = operator!=(&local_98,(char **)local_f8);
      if (bVar2) {
        if ((int)uVar11 < 0) {
          bVar2 = QImageReader::supportsOption((QImageReader *)local_48,Size);
          if (bVar2) {
            do {
              QVar5 = QImageReader::size((QImageReader *)local_48);
              QPixmap::QPixmap((QPixmap *)local_f8);
              local_e0 = &(local_78.d.d)->super_QArrayData;
              local_d8 = local_78.d.ptr;
              pQStack_d0 = (QSize *)local_78.d.size;
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + 1;
                UNLOCK();
              }
              local_c8 = QVar5;
              local_c0 = mode;
              local_bc = state;
              QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                        ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                         (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
              QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
              if (local_e0 != (QArrayData *)0x0) {
                LOCK();
                (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_e0,2,0x10);
                }
              }
              QPixmap::~QPixmap((QPixmap *)local_f8);
              bVar2 = QImageReader::jumpToNextImage((QImageReader *)local_48);
            } while (bVar2);
          }
          else {
            sVar8 = anon_unknown.dwarf_cbe27::ImageReader::read
                              ((ImageReader *)local_48,(int)local_b8,__buf_00,(size_t)__nbytes);
            if ((char)sVar8 != '\0') {
              do {
                QPixmap::QPixmap((QPixmap *)local_f8);
                local_e0 = &(local_78.d.d)->super_QArrayData;
                local_d8 = local_78.d.ptr;
                pQStack_d0 = (QSize *)local_78.d.size;
                if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + 1;
                  UNLOCK();
                }
                local_c8 = QImage::size((QImage *)local_b8);
                local_c0 = mode;
                local_bc = state;
                QPixmap::convertFromImage
                          ((QPixmap *)local_f8,(QImage *)local_b8,(ImageConversionFlags)0x0);
                QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                          ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                           (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
                QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
                if (local_e0 != (QArrayData *)0x0) {
                  LOCK();
                  (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_e0,2,0x10);
                  }
                }
                QPixmap::~QPixmap((QPixmap *)local_f8);
                sVar8 = anon_unknown.dwarf_cbe27::ImageReader::read
                                  ((ImageReader *)local_48,(int)(QImage *)local_b8,__buf_02,
                                   (size_t)__nbytes);
              } while ((char)sVar8 != '\0');
            }
          }
        }
        else {
          QPixmap::QPixmap((QPixmap *)local_f8);
          local_e0 = &(local_78.d.d)->super_QArrayData;
          local_d8 = local_78.d.ptr;
          pQStack_d0 = (QSize *)local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8 = *size;
          local_c0 = mode;
          local_bc = state;
          QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                    ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                     (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
          QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
          if (local_e0 != (QArrayData *)0x0) {
            LOCK();
            (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e0,2,0x10);
            }
          }
          QPixmap::~QPixmap((QPixmap *)local_f8);
        }
      }
      else {
        local_118.d = (Data *)0x0;
        local_118.ptr = (QImage *)0x0;
        local_118.size = 0;
        sVar8 = anon_unknown.dwarf_cbe27::ImageReader::read
                          ((ImageReader *)local_48,(int)local_b8,__buf,(size_t)__nbytes);
        if ((char)sVar8 != '\0') {
          do {
            if (((int)uVar11 < 0) ||
               ((QVar5 = QImage::size((QImage *)local_b8), __nbytes = size, __buf_01 = extraout_RDX,
                (size->wd).m_i == QVar5.wd.m_i.m_i && ((size->ht).m_i == QVar5.ht.m_i.m_i)))) {
              QVar5 = QImage::size((QImage *)local_b8);
              uVar10 = 0xffffffff;
              if (local_118.size != 0) {
                lVar9 = 0;
                uVar12 = 0;
                do {
                  QVar6 = QImage::size((QImage *)
                                       ((long)&((local_118.ptr)->super_QPaintDevice).
                                               _vptr_QPaintDevice + lVar9));
                  if (QVar5 == QVar6) {
                    uVar10 = (uint)uVar12;
                    break;
                  }
                  uVar12 = uVar12 + 1;
                  lVar9 = lVar9 + 0x18;
                  uVar10 = 0xffffffff;
                } while (uVar12 < (ulong)local_118.size);
              }
              if ((int)uVar10 < 0) {
                QtPrivate::QMovableArrayOps<QImage>::emplace<QImage_const&>
                          ((QMovableArrayOps<QImage> *)&local_118,local_118.size,(QImage *)local_b8)
                ;
                QList<QImage>::end((QList<QImage> *)&local_118);
                __buf_01 = extraout_RDX_00;
              }
              else {
                local_e8.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
                local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_60.d.d = (Data *)0x0;
                local_60.d.ptr = L"_q_icoOrigDepth";
                local_60.d.size = 0xf;
                QImage::text((QString *)local_f8,(QImage *)local_b8,&local_60);
                if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (local_e8.d.ptr == (QPlatformPixmap *)0x0) {
                  iVar3 = 0x20;
                }
                else {
                  __nbytes = (QSize *)0xa;
                  QVar13.m_data = (storage_type_conflict *)local_f8._8_8_;
                  QVar13.m_size = (qsizetype)local_e8.d.ptr;
                  lVar9 = QString::toIntegral_helper(QVar13,(bool *)0x0,10);
                  iVar3 = (int)lVar9;
                  if (iVar3 != lVar9) {
                    iVar3 = 0;
                  }
                }
                if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                  }
                }
                local_e8.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
                local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_60.d.d = (Data *)0x0;
                local_60.d.ptr = L"_q_icoOrigDepth";
                local_60.d.size = 0xf;
                QImage::text((QString *)local_f8,local_118.ptr + uVar10,&local_60);
                __buf_01 = extraout_RDX_01;
                if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
                    __buf_01 = extraout_RDX_02;
                  }
                }
                if (local_e8.d.ptr == (QPlatformPixmap *)0x0) {
                  iVar4 = 0x20;
                }
                else {
                  __nbytes = (QSize *)0xa;
                  QVar14.m_data = (storage_type_conflict *)local_f8._8_8_;
                  QVar14.m_size = (qsizetype)local_e8.d.ptr;
                  auVar15 = QString::toIntegral_helper(QVar14,(bool *)0x0,10);
                  __buf_01 = auVar15._8_8_;
                  iVar4 = auVar15._0_4_;
                  if ((long)iVar4 != auVar15._0_8_) {
                    iVar4 = 0;
                  }
                }
                if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
                    __buf_01 = extraout_RDX_03;
                  }
                }
                if (iVar4 < iVar3) {
                  pQVar7 = QList<QImage>::data((QList<QImage> *)&local_118);
                  QImage::operator=(pQVar7 + uVar10,(QImage *)local_b8);
                  __buf_01 = extraout_RDX_04;
                }
              }
            }
            sVar8 = anon_unknown.dwarf_cbe27::ImageReader::read
                              ((ImageReader *)local_48,(int)(QImage *)local_b8,__buf_01,
                               (size_t)__nbytes);
          } while ((char)sVar8 != '\0');
        }
        if (local_118.size != 0) {
          lVar9 = local_118.size * 0x18;
          this_00 = local_118.ptr;
          do {
            QPixmap::QPixmap((QPixmap *)local_f8);
            local_e0 = &(local_78.d.d)->super_QArrayData;
            local_d8 = local_78.d.ptr;
            pQStack_d0 = (QSize *)local_78.d.size;
            if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            local_c8 = QImage::size(this_00);
            local_c0 = mode;
            local_bc = state;
            QPixmap::convertFromImage((QPixmap *)local_f8,this_00,(ImageConversionFlags)0x0);
            QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                      ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                       (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
            QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
            if (local_e0 != (QArrayData *)0x0) {
              LOCK();
              (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_e0,2,0x10);
              }
            }
            QPixmap::~QPixmap((QPixmap *)local_f8);
            this_00 = this_00 + 1;
            lVar9 = lVar9 + -0x18;
          } while (lVar9 != 0);
        }
        if (-1 < (int)uVar11 && local_118.size == 0) {
          QPixmap::QPixmap((QPixmap *)local_f8);
          local_e0 = &(local_78.d.d)->super_QArrayData;
          local_d8 = local_78.d.ptr;
          pQStack_d0 = (QSize *)local_78.d.size;
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8 = *size;
          local_c0 = mode;
          local_bc = state;
          QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry>
                    ((QMovableArrayOps<QPixmapIconEngineEntry> *)&this->pixmaps,
                     (this->pixmaps).d.size,(QPixmapIconEngineEntry *)local_f8);
          QList<QPixmapIconEngineEntry>::end(&this->pixmaps);
          if (local_e0 != (QArrayData *)0x0) {
            LOCK();
            (local_e0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_e0,2,0x10);
            }
          }
          QPixmap::~QPixmap((QPixmap *)local_f8);
        }
        QArrayDataPointer<QImage>::~QArrayDataPointer(&local_118);
      }
      QImage::~QImage((QImage *)local_b8);
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    QImageReader::~QImageReader((QImageReader *)local_48);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapIconEngine::addFile(const QString &fileName, const QSize &size, QIcon::Mode mode, QIcon::State state)
{
    if (fileName.isEmpty())
        return;
    const QString abs = fileName.startsWith(u':') ? fileName : QFileInfo(fileName).absoluteFilePath();
    const bool ignoreSize = !size.isValid();
    ImageReader imageReader(abs);
    const QByteArray format = imageReader.format();
    if (format.isEmpty()) // Device failed to open or unsupported format.
        return;
    QImage image;
    if (format != "ico") {
        if (ignoreSize) { // No size specified: Add all images.
            if (imageReader.supportsReadSize()) {
                do {
                    pixmaps += QPixmapIconEngineEntry(abs, imageReader.size(), mode, state);
                } while (imageReader.jumpToNextImage());
            } else {
                while (imageReader.read(&image))
                    pixmaps += QPixmapIconEngineEntry(abs, image, mode, state);
            }
        } else {
            pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
        }
        return;
    }
    // Special case for reading Windows ".ico" files. Historically (QTBUG-39287),
    // these files may contain low-resolution images. As this information is lost,
    // ICOReader sets the original format as an image text key value. Read all matching
    // images into a list trying to find the highest quality per size.
    QList<QImage> icoImages;
    while (imageReader.read(&image)) {
        if (ignoreSize || image.size() == size) {
            const int position = findBySize(icoImages, image.size());
            if (position >= 0) { // Higher quality available? -> replace.
                if (origIcoDepth(image) > origIcoDepth(icoImages.at(position)))
                    icoImages[position] = image;
            } else {
                icoImages.append(image);
            }
        }
    }
    for (const QImage &i : std::as_const(icoImages))
        pixmaps += QPixmapIconEngineEntry(abs, i, mode, state);
    if (icoImages.isEmpty() && !ignoreSize) // Add placeholder with the filename and empty pixmap for the size.
        pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
}